

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::tracker_request_error
          (torrent *this,tracker_request *r,error_code *ec,operation_t op,string *msg,
          seconds32 retry_interval)

{
  info_hash_t *this_00;
  tracker_list *this_01;
  error_code *peVar1;
  byte bVar2;
  uint uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  endpoint *peVar9;
  undefined3 uVar10;
  bool bVar11;
  bool bVar12;
  event_t e;
  int iVar13;
  time_point32 now;
  char *pcVar14;
  announce_entry *paVar15;
  announce_endpoint *paVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  error_category *peVar17;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer pcVar18;
  endpoint *ep;
  endpoint *ep_00;
  endpoint *ep_01;
  pointer pcVar19;
  _func_int **pp_Var20;
  __normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
  _Var21;
  long lVar22;
  tracker_request *args_3;
  announce_infohash *this_02;
  __normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
  __it;
  long lVar23;
  error_condition eVar24;
  protocol_version hash_version;
  operation_t op_local;
  error_code *local_c0;
  tracker_request *local_b8;
  announce_endpoint *local_b0;
  announce_entry *local_a8;
  array<const_bool,_num_protocols,_protocol_version> supports_protocol;
  int fails;
  endpoint local_endpoint_1;
  endpoint local_endpoint;
  protocol_version hash_version_1;
  
  local_c0 = (error_code *)CONCAT44(local_c0._4_4_,retry_interval.__r);
  this_00 = &this->m_info_hash;
  op_local = op;
  bVar11 = info_hash_t::has_v1(this_00);
  bVar12 = info_hash_t::has_v2(this_00);
  supports_protocol.super_array<const_bool,_2UL>._M_elems[1] = bVar12;
  supports_protocol.super_array<const_bool,_2UL>._M_elems[0] = bVar11;
  iVar13 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
  local_b8 = r;
  if ((char)iVar13 != '\0') {
    uVar3 = ec->val_;
    (*ec->cat_->_vptr_error_category[4])(&local_endpoint_1,ec->cat_,(ulong)uVar3);
    uVar6 = CONCAT44(local_endpoint_1.impl_.data_.v6.sin6_flowinfo,
                     local_endpoint_1.impl_.data_._0_4_);
    pcVar14 = operation_name(op);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** tracker error: (%d) %s [%s] %s",(ulong)uVar3,uVar6,pcVar14,
               (msg->_M_dataplus)._M_p);
    ::std::__cxx11::string::~string((string *)&local_endpoint_1);
  }
  args_3 = local_b8;
  this_01 = &this->m_trackers;
  bVar2 = (local_b8->kind).m_val;
  paVar15 = tracker_list::find_tracker(this_01,&local_b8->url);
  if ((bVar2 & 1) == 0) {
    fails = 0;
    local_endpoint.impl_.data_.v6.sin6_scope_id = 0;
    local_endpoint.impl_.data_._8_1_ = '\0';
    local_endpoint.impl_.data_._9_1_ = '\0';
    local_endpoint.impl_.data_._10_1_ = '\0';
    local_endpoint.impl_.data_._11_1_ = '\0';
    local_endpoint.impl_.data_._12_1_ = '\0';
    local_endpoint.impl_.data_._13_1_ = '\0';
    local_endpoint.impl_.data_._14_1_ = '\0';
    local_endpoint.impl_.data_._15_1_ = '\0';
    local_endpoint.impl_.data_._16_8_ = 0;
    local_endpoint.impl_.data_._0_8_ = 2;
    hash_version = V1;
    if (paVar15 != (announce_entry *)0x0) {
      local_a8 = paVar15;
      paVar16 = announce_entry::find_endpoint(paVar15,&args_3->outgoing_socket);
      if (paVar16 == (announce_endpoint *)0x0) {
        p_Var4 = (args_3->outgoing_socket).m_sock.
                 super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (p_Var4->_M_use_count != 0)) {
          pcVar19 = (args_3->url)._M_dataplus._M_p;
          listen_socket_handle::get_local_endpoint
                    ((endpoint *)&hash_version_1,&args_3->outgoing_socket);
          print_endpoint_abi_cxx11_((string *)&local_endpoint_1,(aux *)&hash_version_1,ep_01);
          pcVar18 = (pointer)CONCAT44(local_endpoint_1.impl_.data_.v6.sin6_flowinfo,
                                      local_endpoint_1.impl_.data_._0_4_);
          pp_Var20 = (this->super_request_callback)._vptr_request_callback;
          pcVar14 = "*** no matching endpoint for request [%s, %s]";
          goto LAB_002e7c31;
        }
      }
      else {
        bVar12 = digest32<160L>::operator==(&args_3->info_hash,&this_00->v1);
        bVar12 = !bVar12;
        this_02 = (paVar16->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                  _M_elems + bVar12;
        local_endpoint.impl_.data_._0_8_ = *(undefined8 *)&(paVar16->local_endpoint).impl_.data_;
        local_endpoint.impl_.data_.v4.sin_zero =
             *(uchar (*) [8])((long)&(paVar16->local_endpoint).impl_.data_ + 8);
        local_endpoint.impl_.data_._16_8_ =
             *(undefined8 *)((long)&(paVar16->local_endpoint).impl_.data_ + 0x10);
        local_endpoint.impl_.data_.v6.sin6_scope_id =
             (paVar16->local_endpoint).impl_.data_.v6.sin6_scope_id;
        hash_version = bVar12;
        iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2e])();
        iVar13 = session_settings::get_int((session_settings *)CONCAT44(extraout_var,iVar13),0x406c)
        ;
        announce_infohash::failed(this_02,iVar13,local_c0._0_4_);
        bVar11 = ec->failed_;
        uVar10 = *(undefined3 *)&ec->field_0x5;
        peVar17 = ec->cat_;
        peVar1 = &(paVar16->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                  _M_elems[bVar12].last_error;
        peVar1->val_ = ec->val_;
        peVar1->failed_ = bVar11;
        *(undefined3 *)&peVar1->field_0x5 = uVar10;
        peVar1->cat_ = peVar17;
        ::std::__cxx11::string::_M_assign((string *)this_02);
        fails = *(ushort *)
                 &(paVar16->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                  _M_elems[bVar12].field_0x44 & 0x7f;
        print_endpoint_abi_cxx11_((string *)&local_endpoint_1,(aux *)paVar16,ep);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"*** increment tracker fail count [ep: %s url: %s %d]",
                   CONCAT44(local_endpoint_1.impl_.data_.v6.sin6_flowinfo,
                            local_endpoint_1.impl_.data_._0_4_),(args_3->url)._M_dataplus._M_p,
                   (ulong)(*(ushort *)
                            &(paVar16->info_hashes).
                             super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[bVar12].
                             field_0x44 & 0x7f));
        ::std::__cxx11::string::~string((string *)&local_endpoint_1);
        eVar24 = boost::system::errc::make_error_condition(address_family_not_supported);
        local_endpoint_1.impl_.data_._0_4_ = eVar24.val_;
        local_endpoint_1.impl_.data_.v6.sin6_flowinfo = eVar24._4_4_;
        local_endpoint_1.impl_.data_._8_4_ = eVar24.cat_._0_4_;
        local_endpoint_1.impl_.data_._12_4_ = eVar24.cat_._4_4_;
        bVar11 = boost::system::operator==(ec,(error_condition *)&local_endpoint_1);
        if (bVar11) {
          paVar16->field_0xb0 = paVar16->field_0xb0 & 0xfe;
          print_endpoint_abi_cxx11_((string *)&local_endpoint_1,(aux *)paVar16,ep_00);
          pcVar19 = (pointer)CONCAT44(local_endpoint_1.impl_.data_.v6.sin6_flowinfo,
                                      local_endpoint_1.impl_.data_._0_4_);
          pcVar18 = (args_3->url)._M_dataplus._M_p;
          pp_Var20 = (this->super_request_callback)._vptr_request_callback;
          pcVar14 = "*** disabling endpoint [ep: %s url: %s ]";
LAB_002e7c31:
          (*pp_Var20[7])(this,pcVar14,pcVar19,pcVar18);
          ::std::__cxx11::string::~string((string *)&local_endpoint_1);
        }
      }
      peVar17 = http_category();
      local_endpoint_1.impl_.data_._0_4_ = 0x19a;
      bVar11 = boost::system::detail::failed_impl(0x19a,peVar17);
      local_endpoint_1.impl_.data_.base.sa_data[2] = bVar11;
      local_endpoint_1.impl_.data_._8_4_ = SUB84(peVar17,0);
      local_endpoint_1.impl_.data_._12_4_ = (undefined4)((ulong)peVar17 >> 0x20);
      local_c0 = ec;
      bVar11 = boost::system::operator==(ec,(error_code *)&local_endpoint_1);
      paVar15 = local_a8;
      if (bVar11) {
        tracker_list::dont_try_again(this_01,local_a8);
      }
      __it._M_current =
           (paVar15->endpoints).
           super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_b0 = (paVar15->endpoints).
                 super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_endpoint_1.impl_.data_._0_8_ = &supports_protocol;
      lVar23 = (long)local_b0 - (long)__it._M_current;
      for (lVar22 = lVar23 / 200 >> 2; paVar15 = local_a8, args_3 = local_b8, ec = local_c0,
          _Var21._M_current = __it._M_current, 0 < lVar22; lVar22 = lVar22 + -1) {
        bVar11 = __gnu_cxx::__ops::
                 _Iter_negate<libtorrent::aux::torrent::tracker_request_error(libtorrent::aux::tracker_request_const&,boost::system::error_code_const&,libtorrent::operation_t,std::__cxx11::string_const&,std::chrono::duration<int,std::ratio<1l,1l>>)::$_0>
                 ::operator()((_Iter_negate<libtorrent::aux::torrent::tracker_request_error(libtorrent::aux::tracker_request_const&,boost::system::error_code_const&,libtorrent::operation_t,std::__cxx11::string_const&,std::chrono::duration<int,std::ratio<1l,1l>>)::__0>
                               *)&local_endpoint_1,__it);
        ec = local_c0;
        args_3 = local_b8;
        paVar15 = local_a8;
        if (bVar11) goto LAB_002e7db0;
        bVar11 = __gnu_cxx::__ops::
                 _Iter_negate<libtorrent::aux::torrent::tracker_request_error(libtorrent::aux::tracker_request_const&,boost::system::error_code_const&,libtorrent::operation_t,std::__cxx11::string_const&,std::chrono::duration<int,std::ratio<1l,1l>>)::$_0>
                 ::operator()((_Iter_negate<libtorrent::aux::torrent::tracker_request_error(libtorrent::aux::tracker_request_const&,boost::system::error_code_const&,libtorrent::operation_t,std::__cxx11::string_const&,std::chrono::duration<int,std::ratio<1l,1l>>)::__0>
                               *)&local_endpoint_1,__it._M_current + 1);
        ec = local_c0;
        _Var21._M_current = __it._M_current + 1;
        args_3 = local_b8;
        paVar15 = local_a8;
        if (bVar11) goto LAB_002e7db0;
        bVar11 = __gnu_cxx::__ops::
                 _Iter_negate<libtorrent::aux::torrent::tracker_request_error(libtorrent::aux::tracker_request_const&,boost::system::error_code_const&,libtorrent::operation_t,std::__cxx11::string_const&,std::chrono::duration<int,std::ratio<1l,1l>>)::$_0>
                 ::operator()((_Iter_negate<libtorrent::aux::torrent::tracker_request_error(libtorrent::aux::tracker_request_const&,boost::system::error_code_const&,libtorrent::operation_t,std::__cxx11::string_const&,std::chrono::duration<int,std::ratio<1l,1l>>)::__0>
                               *)&local_endpoint_1,__it._M_current + 2);
        ec = local_c0;
        _Var21._M_current = __it._M_current + 2;
        args_3 = local_b8;
        paVar15 = local_a8;
        if (bVar11) goto LAB_002e7db0;
        bVar11 = __gnu_cxx::__ops::
                 _Iter_negate<libtorrent::aux::torrent::tracker_request_error(libtorrent::aux::tracker_request_const&,boost::system::error_code_const&,libtorrent::operation_t,std::__cxx11::string_const&,std::chrono::duration<int,std::ratio<1l,1l>>)::$_0>
                 ::operator()((_Iter_negate<libtorrent::aux::torrent::tracker_request_error(libtorrent::aux::tracker_request_const&,boost::system::error_code_const&,libtorrent::operation_t,std::__cxx11::string_const&,std::chrono::duration<int,std::ratio<1l,1l>>)::__0>
                               *)&local_endpoint_1,__it._M_current + 3);
        ec = local_c0;
        _Var21._M_current = __it._M_current + 3;
        args_3 = local_b8;
        paVar15 = local_a8;
        if (bVar11) goto LAB_002e7db0;
        __it._M_current = __it._M_current + 4;
        lVar23 = lVar23 + -800;
      }
      lVar23 = lVar23 / 200;
      if (lVar23 == 1) {
LAB_002e7eb8:
        bVar11 = __gnu_cxx::__ops::
                 _Iter_negate<libtorrent::aux::torrent::tracker_request_error(libtorrent::aux::tracker_request_const&,boost::system::error_code_const&,libtorrent::operation_t,std::__cxx11::string_const&,std::chrono::duration<int,std::ratio<1l,1l>>)::$_0>
                 ::operator()((_Iter_negate<libtorrent::aux::torrent::tracker_request_error(libtorrent::aux::tracker_request_const&,boost::system::error_code_const&,libtorrent::operation_t,std::__cxx11::string_const&,std::chrono::duration<int,std::ratio<1l,1l>>)::__0>
                               *)&local_endpoint_1,__it);
        _Var21._M_current = __it._M_current;
        if (!bVar11) {
          _Var21._M_current = local_b0;
        }
LAB_002e7db0:
        if (_Var21._M_current != local_b0) goto LAB_002e7dc2;
      }
      else {
        if (lVar23 == 2) {
LAB_002e7d7f:
          bVar11 = __gnu_cxx::__ops::
                   _Iter_negate<libtorrent::aux::torrent::tracker_request_error(libtorrent::aux::tracker_request_const&,boost::system::error_code_const&,libtorrent::operation_t,std::__cxx11::string_const&,std::chrono::duration<int,std::ratio<1l,1l>>)::$_0>
                   ::operator()((_Iter_negate<libtorrent::aux::torrent::tracker_request_error(libtorrent::aux::tracker_request_const&,boost::system::error_code_const&,libtorrent::operation_t,std::__cxx11::string_const&,std::chrono::duration<int,std::ratio<1l,1l>>)::__0>
                                 *)&local_endpoint_1,_Var21);
          if (!bVar11) {
            __it._M_current = _Var21._M_current + 1;
            goto LAB_002e7eb8;
          }
          goto LAB_002e7db0;
        }
        if (lVar23 == 3) {
          bVar11 = __gnu_cxx::__ops::
                   _Iter_negate<libtorrent::aux::torrent::tracker_request_error(libtorrent::aux::tracker_request_const&,boost::system::error_code_const&,libtorrent::operation_t,std::__cxx11::string_const&,std::chrono::duration<int,std::ratio<1l,1l>>)::$_0>
                   ::operator()((_Iter_negate<libtorrent::aux::torrent::tracker_request_error(libtorrent::aux::tracker_request_const&,boost::system::error_code_const&,libtorrent::operation_t,std::__cxx11::string_const&,std::chrono::duration<int,std::ratio<1l,1l>>)::__0>
                                 *)&local_endpoint_1,__it);
          if (!bVar11) {
            _Var21._M_current = __it._M_current + 1;
            goto LAB_002e7d7f;
          }
          goto LAB_002e7db0;
        }
      }
      tracker_list::deprioritize_tracker(this_01,paVar15);
    }
LAB_002e7dc2:
    iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    if (((*(uint *)(CONCAT44(extraout_var_02,iVar13) + 0x68) & 0x11) != 0) ||
       (args_3->triggered_manually == true)) {
      iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      get_handle((torrent *)&local_endpoint_1);
      alert_manager::
      emplace_alert<libtorrent::tracker_error_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int&,libtorrent::protocol_version&,std::__cxx11::string_const&,libtorrent::operation_t_const&,boost::system::error_code_const&,std::__cxx11::string_const&>
                ((alert_manager *)CONCAT44(extraout_var_03,iVar13),
                 (torrent_handle *)&local_endpoint_1,&local_endpoint,&fails,&hash_version,
                 &args_3->url,&op_local,ec,msg);
      peVar9 = &local_endpoint_1;
LAB_002e7e2f:
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(peVar9->impl_).data_.v6.sin6_addr);
    }
  }
  else {
    peVar17 = http_category();
    local_endpoint_1.impl_.data_._0_4_ = 0x19a;
    bVar11 = boost::system::detail::failed_impl(0x19a,peVar17);
    local_endpoint_1.impl_.data_.base.sa_data[2] = bVar11;
    local_endpoint_1.impl_.data_._8_4_ = SUB84(peVar17,0);
    local_endpoint_1.impl_.data_._12_4_ = (undefined4)((ulong)peVar17 >> 0x20);
    local_c0 = ec;
    bVar11 = boost::system::operator==(ec,(error_code *)&local_endpoint_1);
    if ((paVar15 != (announce_entry *)0x0) && (bVar11)) {
      tracker_list::dont_try_again(this_01,paVar15);
    }
    iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    args_3 = local_b8;
    if (((*(uint *)(CONCAT44(extraout_var_00,iVar13) + 0x68) & 0x11) != 0) ||
       (local_b8->triggered_manually == true)) {
      local_endpoint_1.impl_.data_.v6.sin6_scope_id = 0;
      local_endpoint_1.impl_.data_._8_4_ = 0;
      local_endpoint_1.impl_.data_._12_4_ = 0;
      local_endpoint_1.impl_.data_._16_4_ = 0;
      local_endpoint_1.impl_.data_._20_4_ = 0;
      local_endpoint_1.impl_.data_._0_4_ = 2;
      local_endpoint_1.impl_.data_.v6.sin6_flowinfo = 0;
      if ((paVar15 != (announce_entry *)0x0) &&
         (paVar16 = announce_entry::find_endpoint(paVar15,&local_b8->outgoing_socket),
         paVar16 != (announce_endpoint *)0x0)) {
        uVar6 = *(undefined8 *)&(paVar16->local_endpoint).impl_.data_;
        uVar7 = *(undefined8 *)((long)&(paVar16->local_endpoint).impl_.data_ + 8);
        uVar8 = *(undefined8 *)((long)&(paVar16->local_endpoint).impl_.data_ + 0x14);
        local_endpoint_1.impl_.data_._16_4_ =
             (undefined4)
             ((ulong)*(undefined8 *)((long)&(paVar16->local_endpoint).impl_.data_ + 0xc) >> 0x20);
        local_endpoint_1.impl_.data_._20_4_ = (undefined4)uVar8;
        local_endpoint_1.impl_.data_.v6.sin6_scope_id = (uint32_t)((ulong)uVar8 >> 0x20);
        local_endpoint_1.impl_.data_._0_4_ = (undefined4)uVar6;
        local_endpoint_1.impl_.data_.v6.sin6_flowinfo = (uint32_t)((ulong)uVar6 >> 0x20);
        local_endpoint_1.impl_.data_._8_4_ = (undefined4)uVar7;
        local_endpoint_1.impl_.data_._12_4_ = (undefined4)((ulong)uVar7 >> 0x20);
      }
      bVar11 = digest32<160L>::operator==(&args_3->info_hash,&this_00->v1);
      hash_version_1 = !bVar11;
      iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      get_handle((torrent *)&local_endpoint);
      alert_manager::
      emplace_alert<libtorrent::scrape_failed_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::protocol_version&,std::__cxx11::string_const&,boost::system::error_code_const&>
                ((alert_manager *)CONCAT44(extraout_var_01,iVar13),(torrent_handle *)&local_endpoint
                 ,&local_endpoint_1,&hash_version_1,&args_3->url,local_c0);
      peVar9 = &local_endpoint;
      goto LAB_002e7e2f;
    }
  }
  uVar5 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  if ((uVar5 & 0x1c000000) == 0) {
    e = args_3->event;
    if (e != stopped && (uVar5 & 0xe00000000000000) == 0x200000000000000) goto LAB_002e7e53;
  }
  else {
    e = stopped;
    if (args_3->event != stopped) goto LAB_002e7e53;
  }
  announce_with_tracker(this,e);
LAB_002e7e53:
  now = time_now32();
  update_tracker_timer(this,now);
  return;
}

Assistant:

void torrent::tracker_request_error(tracker_request const& r
		, error_code const& ec, operation_t const op, std::string const& msg
		, seconds32 const retry_interval)
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

// some older versions of clang had a bug where it would fire this warning here
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-braces"
#endif
		aux::array<bool const, num_protocols, protocol_version> const supports_protocol
		{ {
			m_info_hash.has_v1(),
			m_info_hash.has_v2()
		} };
#ifdef __clang__
#pragma clang diagnostic pop
#endif

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("*** tracker error: (%d) %s [%s] %s", ec.value()
				, ec.message().c_str(), operation_name(op), msg.c_str());
		}
#endif
		if (!(r.kind & tracker_request::scrape_request))
		{
			// announce request
			aux::announce_entry* ae = m_trackers.find_tracker(r.url);
			int fails = 0;
			tcp::endpoint local_endpoint;
			protocol_version hash_version = protocol_version::V1;
			if (ae)
			{
				auto* aep = ae->find_endpoint(r.outgoing_socket);
				if (aep)
				{
					hash_version = r.info_hash == m_info_hash.v1
						? protocol_version::V1 : protocol_version::V2;
					auto& a = aep->info_hashes[hash_version];
					local_endpoint = aep->local_endpoint;
					a.failed(settings().get_int(settings_pack::tracker_backoff)
						, retry_interval);
					a.last_error = ec;
					a.message = msg;
					fails = a.fails;

#ifndef TORRENT_DISABLE_LOGGING
					debug_log("*** increment tracker fail count [ep: %s url: %s %d]"
						, print_endpoint(aep->local_endpoint).c_str(), r.url.c_str(), a.fails);
#endif
					if (ec == boost::system::errc::address_family_not_supported)
					{
						// don't try to announce from this endpoint again
						aep->enabled = false;
#ifndef TORRENT_DISABLE_LOGGING
						debug_log("*** disabling endpoint [ep: %s url: %s ]"
							, print_endpoint(aep->local_endpoint).c_str(), r.url.c_str());
#endif
					}
				}
				else if (r.outgoing_socket)
				{
#ifndef TORRENT_DISABLE_LOGGING
					debug_log("*** no matching endpoint for request [%s, %s]"
						, r.url.c_str(), print_endpoint(r.outgoing_socket.get_local_endpoint()).c_str());
#endif
				}

				// never talk to this tracker again
				if (ec == error_code(410, http_category())) m_trackers.dont_try_again(ae);

				// if all endpoints fail, then we de-prioritize the tracker and try
				// the next one in the tier
				if (std::all_of(ae->endpoints.begin(), ae->endpoints.end()
					, [&](aux::announce_endpoint const& ep)
					{
						for (protocol_version const ih : all_versions)
							if (supports_protocol[ih] && ep.info_hashes[ih].is_working())
								return false;
						return true;
					}))
				{
					m_trackers.deprioritize_tracker(ae);
				}
			}
			if (m_ses.alerts().should_post<tracker_error_alert>()
				|| r.triggered_manually)
			{
				m_ses.alerts().emplace_alert<tracker_error_alert>(get_handle()
					, local_endpoint, fails, hash_version, r.url, op, ec, msg);
			}
		}
		else
		{
			aux::announce_entry* ae = m_trackers.find_tracker(r.url);

			// scrape request
			if (ec == error_code(410, http_category()) && ae)
				m_trackers.dont_try_again(ae);

			// if this was triggered manually we need to post this unconditionally,
			// since the client expects a response from its action, regardless of
			// whether all tracker events have been enabled by the alert mask
			if (m_ses.alerts().should_post<scrape_failed_alert>()
				|| r.triggered_manually)
			{
				tcp::endpoint local_endpoint;
				if (ae)
				{
					auto const* aep = ae->find_endpoint(r.outgoing_socket);
					if (aep != nullptr) local_endpoint = aep->local_endpoint;
				}

				protocol_version hash_version = r.info_hash == m_info_hash.v1
					? protocol_version::V1 : protocol_version::V2;

				m_ses.alerts().emplace_alert<scrape_failed_alert>(get_handle()
					, local_endpoint, hash_version, r.url, ec);
			}
		}
		// announce to the next working tracker
		// We may have changed state into checking by now, in which case we
		// shouldn't keep trying to announce
		if ((!m_abort && !is_paused() && state() != torrent_status::checking_files)
			|| r.event == event_t::stopped)
		{
			announce_with_tracker(r.event);
		}
		update_tracker_timer(aux::time_now32());
	}